

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.h
# Opt level: O2

shared_ptr<cppcms::application_specific_pool> cppcms::create_pool<async_unit_test>(void)

{
  simple_application_specific_pool1<async_unit_test,_std::_Bind<async_unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
  *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<cppcms::application_specific_pool> sVar1;
  _Bind<async_unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)> local_20;
  
  this = (simple_application_specific_pool1<async_unit_test,_std::_Bind<async_unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
          *)operator_new(0x30);
  local_20._M_f = details::create_app<async_unit_test>;
  details::
  simple_application_specific_pool1<async_unit_test,_std::_Bind<async_unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
  ::simple_application_specific_pool1(this,&local_20);
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::details::simple_application_specific_pool1<async_unit_test,std::_Bind<async_unit_test*(*(std::_Placeholder<1>))(cppcms::service&)>>,void>
            (in_RDI,this);
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<cppcms::application_specific_pool>)
         sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<application_specific_pool> create_pool(P...p)
	{
        auto functor = std::bind(&details::create_app<T,P...>,std::placeholders::_1,p...);
        typedef details::simple_application_specific_pool1<T,decltype(functor)> pool_type;
		booster::shared_ptr<application_specific_pool> f(new pool_type(std::move(functor)));
		return f;
	}